

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O0

void la_dgeadd_os(int m,int n,double *a,int lda,double *b,int ldb,double *c,int ldc)

{
  int local_34;
  int local_30;
  int j;
  int i;
  int ldb_local;
  double *b_local;
  int lda_local;
  double *a_local;
  int n_local;
  int m_local;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x27,
                  "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x28,
                  "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (c == (double *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x29,
                  "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if ((0 < lda) && (n <= lda)) {
    if ((ldb < 1) || (ldb < n)) {
      __assert_fail("ldb >= 1 && ldb >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x2b,
                    "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    if ((0 < ldc) && (n <= ldc)) {
      for (local_30 = 0; local_30 < m; local_30 = local_30 + 1) {
        for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
          c[local_30 * ldc + local_34] = a[local_30 * lda + local_34] + b[local_30 * ldb + local_34]
          ;
        }
      }
      return;
    }
    __assert_fail("ldc >= 1 && ldc >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x2c,
                  "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("lda >= 1 && lda >= n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x2a,
                "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgeadd_os(
        int m, int n,
        const double *a, int lda,
        const double *b, int ldb,
        double *c, int ldc)
{
    assert(a);
    assert(b);
    assert(c);
    assert(lda >= 1 && lda >= n);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);

    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            c[i * ldc + j] = a[i * lda + j] + b[i * ldb + j];
        }
    }
}